

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O1

uint64_t __thiscall
kj::parse::_::ParseInteger<10U>::operator()(ParseInteger<10U> *this,char first,Array<char> *digits)

{
  char cVar1;
  uint64_t uVar2;
  Array<char> *__range3;
  size_t sVar3;
  char cVar4;
  
  cVar1 = (first < 'a') * ' ' + -0x57;
  if (first < 'A') {
    cVar1 = -0x30;
  }
  uVar2 = (uint64_t)(char)(cVar1 + first);
  if (digits->size_ != 0) {
    sVar3 = 0;
    do {
      cVar1 = digits->ptr[sVar3];
      cVar4 = (cVar1 < 'a') * ' ' + -0x57;
      if (cVar1 < 'A') {
        cVar4 = -0x30;
      }
      uVar2 = (long)(char)(cVar4 + cVar1) + uVar2 * 10;
      sVar3 = sVar3 + 1;
    } while (digits->size_ != sVar3);
  }
  return uVar2;
}

Assistant:

inline char parseDigit(char c) {
  if (c < 'A') return c - '0';
  if (c < 'a') return c - 'A' + 10;
  return c - 'a' + 10;
}